

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_encoder.cc
# Opt level: O0

bool __thiscall draco::PointCloudEncoder::EncodeAllAttributes(PointCloudEncoder *this)

{
  bool bVar1;
  uint uVar2;
  reference piVar3;
  pointer pAVar4;
  vector<int,_std::allocator<int>_> *in_RDI;
  int att_encoder_id;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  pointer *local_18;
  
  local_18 = &in_RDI[2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  local_20._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(in_RDI);
  std::vector<int,_std::allocator<int>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)in_RDI);
    if (!bVar1) {
      return true;
    }
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_20);
    in_stack_ffffffffffffffd4 = *piVar3;
    std::
    vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
    ::operator[]((vector<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>,_std::allocator<std::unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>_>_>
                  *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(long)in_stack_ffffffffffffffd4);
    pAVar4 = std::
             unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>::
             operator->((unique_ptr<draco::AttributesEncoder,_std::default_delete<draco::AttributesEncoder>_>
                         *)0x1b03b8);
    uVar2 = (*pAVar4->_vptr_AttributesEncoder[5])
                      (pAVar4,in_RDI[3].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_20);
  }
  return false;
}

Assistant:

bool PointCloudEncoder::EncodeAllAttributes() {
  for (int att_encoder_id : attributes_encoder_ids_order_) {
    if (!attributes_encoders_[att_encoder_id]->EncodeAttributes(buffer_)) {
      return false;
    }
  }
  return true;
}